

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

void __thiscall duckdb::HyperLogLog::Serialize(HyperLogLog *this,Serializer *serializer)

{
  const_data_ptr_t ptr;
  bool bVar1;
  pointer pHVar2;
  uint64_t count;
  HLLStorageType local_22 [2];
  templated_unique_single_t old;
  
  bVar1 = SerializationCompatibility::Compare(&(serializer->options).serialization_compatibility,3);
  if (bVar1) {
    local_22[1] = 2;
    Serializer::WriteProperty<duckdb::HLLStorageType>(serializer,100,"type",local_22 + 1);
    Serializer::WriteProperty(serializer,0x65,"data",this->k,0x40);
  }
  else {
    make_uniq<duckdb::HLLV1>();
    pHVar2 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    HLLV1::FromNew(pHVar2,this);
    local_22[0] = HLL_V1;
    Serializer::WriteProperty<duckdb::HLLStorageType>(serializer,100,"type",local_22);
    pHVar2 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    ptr = (const_data_ptr_t)pHVar2->hll->ptr;
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    count = duckdb_hll::get_size();
    Serializer::WriteProperty(serializer,0x65,"data",ptr,count);
    ::std::unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_>::~unique_ptr
              (&old.super_unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_>);
  }
  return;
}

Assistant:

void HyperLogLog::Serialize(Serializer &serializer) const {
	if (serializer.ShouldSerialize(3)) {
		serializer.WriteProperty(100, "type", HLLStorageType::HLL_V2);
		serializer.WriteProperty(101, "data", k, sizeof(k));
	} else {
		auto old = make_uniq<HLLV1>();
		old->FromNew(*this);

		serializer.WriteProperty(100, "type", HLLStorageType::HLL_V1);
		serializer.WriteProperty(101, "data", old->GetPtr(), old->GetSize());
	}
}